

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioFunc.c
# Opt level: O1

int Mio_GateParseFormula(Mio_Gate_t *pGate)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  uint nVars;
  int iVar4;
  int iVar5;
  Mio_Pin_t *pMVar6;
  Mio_Pin_t *pMVar7;
  int *piVar8;
  Vec_Int_t *pVVar9;
  char *pcVar10;
  void *__ptr;
  word *pwVar11;
  long lVar12;
  ulong *__ptr_00;
  ulong *puVar13;
  long lVar14;
  ulong uVar15;
  char *__s1;
  uint uVar16;
  char *__format;
  ulong *puVar17;
  ulong uVar18;
  ulong *puVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  Mio_Pin_t **ppMVar23;
  uint uVar24;
  undefined1 *__dest;
  char *pPinNames [100];
  word Truth8 [8] [4];
  char *pPinNamesCopy [100];
  long alStack_7b8 [8];
  char *local_778 [100];
  undefined1 local_458 [256];
  undefined8 local_358 [101];
  
  pGate->dDelayMax = 0.0;
  pMVar6 = Mio_GateReadPins(pGate);
  pMVar7 = pMVar6;
  if (pMVar6 != (Mio_Pin_t *)0x0) {
    do {
      dVar1 = pMVar7->dDelayBlockMax;
      if (pGate->dDelayMax <= dVar1 && dVar1 != pGate->dDelayMax) {
        pGate->dDelayMax = dVar1;
      }
      pMVar7 = Mio_PinReadNext(pMVar7);
    } while (pMVar7 != (Mio_Pin_t *)0x0);
    if (pMVar6 != (Mio_Pin_t *)0x0) {
      nVars = Mio_GateCollectNames(pGate->pForm,local_778);
      if (nVars != 0) {
        pGate->nInputs = nVars;
        pMVar7 = pGate->pPins;
        pcVar10 = pMVar7->pName;
        iVar4 = strcmp(pcVar10,"*");
        if (iVar4 == 0) {
          if (pcVar10 != (char *)0x0) {
            free(pcVar10);
            pMVar7->pName = (char *)0x0;
          }
          ppMVar23 = &pMVar7->pNext;
          if (1 < (int)nVars) {
            uVar15 = 1;
            do {
              pMVar6 = Mio_PinDup(pMVar7);
              *ppMVar23 = pMVar6;
              pMVar6->pName = local_778[uVar15];
              uVar15 = uVar15 + 1;
              ppMVar23 = &(*ppMVar23)->pNext;
            } while (nVars != uVar15);
          }
          *ppMVar23 = (Mio_Pin_t *)0x0;
          pMVar7->pName = local_778[0];
        }
        else {
          pMVar7 = Mio_GateReadPins(pGate);
          if (pMVar7 != (Mio_Pin_t *)0x0) {
            iVar4 = 0;
            do {
              if (0 < (int)nVars) {
                uVar15 = 0;
                do {
                  pcVar10 = local_778[uVar15];
                  if ((pcVar10 != (char *)0x0) &&
                     (iVar5 = strcmp(pcVar10,pMVar7->pName), iVar5 == 0)) {
                    free(pcVar10);
                    local_778[uVar15] = (char *)0x0;
                    lVar12 = (long)iVar4;
                    iVar4 = iVar4 + 1;
                    local_358[lVar12] = pMVar7->pName;
                    break;
                  }
                  uVar15 = uVar15 + 1;
                } while (nVars != uVar15);
              }
              pMVar7 = Mio_PinReadNext(pMVar7);
            } while (pMVar7 != (Mio_Pin_t *)0x0);
          }
          if (0 < (int)nVars) {
            uVar15 = 0;
            do {
              if (local_778[uVar15] != (char *)0x0) {
                printf("Name \"%s\" appears in the formula \"%s\" of gate \"%s\" but there is no such pin.\n"
                       ,local_778[uVar15],pGate->pForm,pGate->pName);
                return 1;
              }
              uVar15 = uVar15 + 1;
            } while (nVars != uVar15);
          }
          memcpy(local_778,local_358,(long)(int)nVars << 3);
        }
        pVVar9 = Mio_ParseFormula(pGate->pForm,local_778,nVars);
        pGate->vExpr = pVVar9;
        pcVar10 = Mio_LibDeriveSop(nVars,pVVar9,pGate->pLib->vCube);
        pGate->pSop = pcVar10;
        pcVar10 = Mio_SopRegister(pGate->pLib->pMmFlex,pcVar10);
        pGate->pSop = pcVar10;
        if ((int)nVars < 7) {
          pVVar9 = pGate->vExpr;
          iVar4 = pVVar9->nSize;
          uVar15 = (ulong)iVar4;
          __ptr = calloc((long)(iVar4 / 2),8);
          if (1 < (long)uVar15) {
            uVar18 = 0;
            do {
              if (uVar15 + 1 >> 1 == uVar18) goto LAB_008ab3bd;
              uVar24 = pVVar9->pArray[uVar18 * 2];
              if (uVar24 == 0xffffffff) {
                uVar21 = 0;
              }
              else if (uVar24 == 0xfffffffe) {
                uVar21 = 0xffffffffffffffff;
              }
              else if ((int)uVar24 < (int)(nVars * 2)) {
                if ((uVar24 & 1) == 0) {
                  uVar21 = *(ulong *)(Exp_Truth6_Truth6 + (long)((int)uVar24 >> 1) * 8);
                }
                else {
                  uVar21 = *(ulong *)(Exp_Truth6_Truth6 + (long)((int)uVar24 / 2) * 8);
LAB_008aafcc:
                  uVar21 = ~uVar21;
                }
              }
              else {
                if ((uVar24 & 1) != 0) {
                  uVar21 = *(ulong *)((long)__ptr + (long)(int)((int)uVar24 / 2 - nVars) * 8);
                  goto LAB_008aafcc;
                }
                uVar21 = *(ulong *)((long)__ptr + (long)(int)(((int)uVar24 >> 1) - nVars) * 8);
              }
              if (uVar15 >> 1 == uVar18) goto LAB_008ab3bd;
              uVar24 = pVVar9->pArray[uVar18 * 2 + 1];
              if (uVar24 == 0xffffffff) {
                uVar22 = 0;
              }
              else if (uVar24 == 0xfffffffe) {
                uVar22 = 0xffffffffffffffff;
              }
              else if ((int)uVar24 < (int)(nVars * 2)) {
                if ((uVar24 & 1) == 0) {
                  uVar22 = *(ulong *)(Exp_Truth6_Truth6 + (long)((int)uVar24 >> 1) * 8);
                }
                else {
                  uVar22 = *(ulong *)(Exp_Truth6_Truth6 + (long)((int)uVar24 / 2) * 8);
LAB_008ab04f:
                  uVar22 = ~uVar22;
                }
              }
              else {
                if ((uVar24 & 1) != 0) {
                  uVar22 = *(ulong *)((long)__ptr + (long)(int)((int)uVar24 / 2 - nVars) * 8);
                  goto LAB_008ab04f;
                }
                uVar22 = *(ulong *)((long)__ptr + (long)(int)(((int)uVar24 >> 1) - nVars) * 8);
              }
              *(ulong *)((long)__ptr + uVar18 * 8) = uVar22 & uVar21;
              uVar18 = uVar18 + 1;
            } while ((uint)(iVar4 / 2) != uVar18);
          }
          if (0 < iVar4) {
            uVar24 = pVVar9->pArray[uVar15 - 1];
            if (uVar24 == 0xffffffff) {
              uVar15 = 0;
            }
            else if (uVar24 == 0xfffffffe) {
              uVar15 = 0xffffffffffffffff;
            }
            else {
              if ((int)uVar24 < (int)(nVars * 2)) {
                if ((uVar24 & 1) == 0) {
                  uVar15 = *(ulong *)(Exp_Truth6_Truth6 + (long)((int)uVar24 >> 1) * 8);
                  goto LAB_008ab398;
                }
                uVar15 = *(ulong *)(Exp_Truth6_Truth6 + (long)((int)uVar24 / 2) * 8);
              }
              else {
                if ((uVar24 & 1) == 0) {
                  uVar15 = *(ulong *)((long)__ptr + (long)(int)(((int)uVar24 >> 1) - nVars) * 8);
                  goto LAB_008ab398;
                }
                uVar15 = *(ulong *)((long)__ptr + (long)(int)((int)uVar24 / 2 - nVars) * 8);
              }
              uVar15 = ~uVar15;
            }
LAB_008ab398:
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            (pGate->field_15).uTruth = uVar15;
            return 0;
          }
        }
        else {
          if (8 < (int)nVars) {
            return 0;
          }
          pwVar11 = (word *)calloc(4,8);
          (pGate->field_15).pTruth = pwVar11;
          pVVar9 = pGate->vExpr;
          __dest = local_458;
          memcpy(__dest,&DAT_00a57dd0,0x100);
          uVar24 = pVVar9->nSize;
          uVar15 = (ulong)(int)uVar24;
          if (0 < (long)uVar15) {
            piVar8 = pVVar9->pArray;
            uVar2 = piVar8[uVar15 - 1];
            lVar12 = 0;
            do {
              alStack_7b8[lVar12] = (long)__dest;
              lVar12 = lVar12 + 1;
              __dest = __dest + 0x20;
            } while (lVar12 != 8);
            if (uVar24 == 1) {
              if (SBORROW4(uVar2,nVars * 2) == (int)(uVar2 + nVars * -2) < 0) {
                __assert_fail("iRoot < 2 * nVars",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/exp.h"
                              ,0xe3,"void Exp_Truth8(int, Vec_Int_t *, word **, word *)");
              }
              if (0xfffffffd < uVar2) {
                lVar12 = 0;
                do {
                  pwVar11[lVar12] = -(ulong)(uVar2 != 0xffffffff);
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 4);
                return 0;
              }
              if (-1 < (int)uVar2) {
                lVar12 = alStack_7b8[uVar2 >> 1];
                lVar14 = 0;
                do {
                  pwVar11[lVar14] = *(ulong *)(lVar12 + lVar14 * 8) ^ (long)(int)-(uVar2 & 1);
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 4);
                return 0;
              }
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            uVar24 = uVar24 >> 1;
            __ptr_00 = (ulong *)calloc((ulong)(uVar24 * 4),8);
            uVar18 = 0;
            puVar17 = __ptr_00;
            while (puVar13 = puVar17, uVar21 = uVar18, uVar21 != uVar15 + 1 >> 1) {
              uVar20 = piVar8[uVar21 * 2];
              if ((int)uVar20 < 0) goto LAB_008ab3dc;
              if (uVar21 == uVar15 >> 1) break;
              uVar3 = piVar8[uVar21 * 2 + 1];
              if ((int)uVar3 < 0) goto LAB_008ab3dc;
              uVar16 = uVar20 >> 1;
              if ((int)uVar16 < (int)nVars) {
                puVar17 = (ulong *)alStack_7b8[uVar16];
              }
              else {
                puVar17 = __ptr_00 + (int)((uVar16 - nVars) * 4);
              }
              uVar16 = uVar3 >> 1;
              if ((int)uVar16 < (int)nVars) {
                puVar19 = (ulong *)alStack_7b8[uVar16];
              }
              else {
                puVar19 = __ptr_00 + (int)((uVar16 - nVars) * 4);
              }
              uVar20 = uVar20 & 1;
              if ((uVar3 & uVar20) == 0) {
                if ((uVar20 == 0) || ((uVar3 & 1) != 0)) {
                  if ((uVar20 == 0) && ((uVar3 & 1) != 0)) {
                    lVar12 = 0;
                    do {
                      puVar13[lVar12] = ~puVar19[lVar12] & puVar17[lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                  }
                  else {
                    lVar12 = 0;
                    do {
                      puVar13[lVar12] = puVar19[lVar12] & puVar17[lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                  }
                }
                else {
                  lVar12 = 0;
                  do {
                    puVar13[lVar12] = ~puVar17[lVar12] & puVar19[lVar12];
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 4);
                }
              }
              else {
                lVar12 = 0;
                do {
                  puVar13[lVar12] = ~(puVar19[lVar12] | puVar17[lVar12]);
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 4);
              }
              uVar18 = uVar21 + 1;
              puVar17 = puVar13 + 4;
              if (uVar21 + 1 == (ulong)(uVar24 + (uVar24 == 0))) {
                if (-1 < (int)uVar2) {
                  if ((uVar2 >> 1) - nVars != (int)uVar21) {
                    __assert_fail("Abc_Lit2Var(iRoot) - nVars == i - 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/exp.h"
                                  ,0x103,"void Exp_Truth8(int, Vec_Int_t *, word **, word *)");
                  }
                  lVar12 = 0;
                  do {
                    pwVar11[lVar12] = *puVar13 ^ -(ulong)(uVar2 & 1);
                    lVar12 = lVar12 + 1;
                    puVar13 = puVar13 + 1;
                  } while (lVar12 != 4);
                  if (__ptr_00 == (ulong *)0x0) {
                    return 0;
                  }
                  free(__ptr_00);
                  return 0;
                }
LAB_008ab3dc:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
            }
LAB_008ab3bd:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
        }
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
      }
      pcVar10 = pGate->pName;
      __s1 = pGate->pForm;
      __format = "Cannot read formula \"%s\" of gate \"%s\".\n";
      goto LAB_008aade8;
    }
  }
  __s1 = pGate->pForm;
  iVar4 = strcmp(__s1,"CONST0");
  if (iVar4 == 0) {
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    pVVar9->nCap = 0x10;
    pVVar9->nSize = 0;
    piVar8 = (int *)malloc(0x40);
    pVVar9->pArray = piVar8;
    Vec_IntPush(pVVar9,-1);
    pGate->vExpr = pVVar9;
    pcVar10 = Mio_SopRegister(pGate->pLib->pMmFlex," 0\n");
    pGate->pSop = pcVar10;
    (pGate->field_15).uTruth = 0;
    pGate->pLib->pGate0 = pGate;
  }
  else {
    iVar4 = strcmp(__s1,"CONST1");
    if (iVar4 != 0) {
      pcVar10 = pGate->pName;
      __format = "Cannot parse formula \"%s\" of gate \"%s\".\n";
LAB_008aade8:
      printf(__format,__s1,pcVar10);
      return 1;
    }
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    pVVar9->nCap = 0x10;
    pVVar9->nSize = 0;
    piVar8 = (int *)malloc(0x40);
    pVVar9->pArray = piVar8;
    Vec_IntPush(pVVar9,-2);
    pGate->vExpr = pVVar9;
    pcVar10 = Mio_SopRegister(pGate->pLib->pMmFlex," 1\n");
    pGate->pSop = pcVar10;
    (pGate->field_15).uTruth = 0xffffffffffffffff;
    pGate->pLib->pGate1 = pGate;
  }
  return 0;
}

Assistant:

int Mio_GateParseFormula( Mio_Gate_t * pGate )
{
    char * pPinNames[100];
    char * pPinNamesCopy[100];
    Mio_Pin_t * pPin, ** ppPin;
    int nPins, iPin, i;

    // set the maximum delay of the gate; count pins
    pGate->dDelayMax = 0.0;
    nPins = 0;
    Mio_GateForEachPin( pGate, pPin )
    {
        // set the maximum delay of the gate
        if ( pGate->dDelayMax < pPin->dDelayBlockMax )
            pGate->dDelayMax = pPin->dDelayBlockMax;
        // count the pin
        nPins++;
    }

    // check for the gate with const function
    if ( nPins == 0 )
    {
        if ( strcmp( pGate->pForm, MIO_STRING_CONST0 ) == 0 )
        {
//            pGate->bFunc = b0;
            pGate->vExpr = Exp_Const0();
            pGate->pSop = Mio_SopRegister( (Mem_Flex_t *)pGate->pLib->pMmFlex, " 0\n" );
            pGate->uTruth = 0;
            pGate->pLib->pGate0 = pGate;
        }
        else if ( strcmp( pGate->pForm, MIO_STRING_CONST1 ) == 0 )
        {
//            pGate->bFunc = b1;
            pGate->vExpr = Exp_Const1();
            pGate->pSop = Mio_SopRegister( (Mem_Flex_t *)pGate->pLib->pMmFlex, " 1\n" );
            pGate->uTruth = ~(word)0;
            pGate->pLib->pGate1 = pGate;
        }
        else
        {
            printf( "Cannot parse formula \"%s\" of gate \"%s\".\n", pGate->pForm, pGate->pName );
            return 1;
        }
//        Cudd_Ref( pGate->bFunc );
        return 0;
    }

    // collect the names as they appear in the formula
    nPins = Mio_GateCollectNames( pGate->pForm, pPinNames );
    if ( nPins == 0 )
    {
        printf( "Cannot read formula \"%s\" of gate \"%s\".\n", pGate->pForm, pGate->pName );
        return 1;
    }

    // set the number of inputs
    pGate->nInputs = nPins;

    // consider the case when all the pins have identical pin info
    if ( strcmp( pGate->pPins->pName, "*" ) == 0 )
    {
        // get the topmost (generic) pin
        pPin = pGate->pPins;
        ABC_FREE( pPin->pName );

        // create individual pins from the generic pin
        ppPin = &pPin->pNext;
        for ( i = 1; i < nPins; i++ )
        {
            // get the new pin
            *ppPin = Mio_PinDup( pPin );
            // set its name
            (*ppPin)->pName = pPinNames[i];
            // prepare the next place in the list
            ppPin = &((*ppPin)->pNext);
        }
        *ppPin = NULL;

        // set the name of the topmost pin
        pPin->pName = pPinNames[0];
    }
    else
    {
        // reorder the variable names to appear the save way as the pins
        iPin = 0;
        Mio_GateForEachPin( pGate, pPin )
        {
            // find the pin with the name pPin->pName
            for ( i = 0; i < nPins; i++ )
            {
                if ( pPinNames[i] && strcmp( pPinNames[i], pPin->pName ) == 0 )
                {
                    // free pPinNames[i] because it is already available as pPin->pName
                    // setting pPinNames[i] to NULL is useful to make sure that
                    // this name is not assigned to two pins in the list
                    ABC_FREE( pPinNames[i] );
                    pPinNamesCopy[iPin++] = pPin->pName;
                    break;
                }
                if ( i == nPins )
                {
                    printf( "Cannot find pin name \"%s\" in the formula \"%s\" of gate \"%s\".\n", 
                        pPin->pName, pGate->pForm, pGate->pName );
                    return 1;
                }
            }
        }

        // check for the remaining names
        for ( i = 0; i < nPins; i++ )
            if ( pPinNames[i] )
            {
                printf( "Name \"%s\" appears in the formula \"%s\" of gate \"%s\" but there is no such pin.\n", 
                    pPinNames[i], pGate->pForm, pGate->pName );
                return 1;
            }

        // copy the names back
        memcpy( pPinNames, pPinNamesCopy, nPins * sizeof(char *) );
    }
/*
    // expand the manager if necessary
    if ( dd->size < nPins )
    {
        Cudd_Quit( dd );
        dd = Cudd_Init( nPins + 10, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
        Cudd_zddVarsFromBddVars( dd, 2 );
    }
    // derive formula as the BDD
    pGate->bFunc = Parse_FormulaParser( stdout, pGate->pForm, nPins, 0, pPinNames, dd, dd->vars );
    if ( pGate->bFunc == NULL )
        return 1;
    Cudd_Ref( pGate->bFunc );
    // derive cover
    pGate->pSop = Abc_ConvertBddToSop( pGate->pLib->pMmFlex, dd, pGate->bFunc, pGate->bFunc, nPins, 0, pGate->pLib->vCube, -1 );
*/

    // derive expression 
    pGate->vExpr = Mio_ParseFormula( pGate->pForm, (char **)pPinNames, nPins );
//    Mio_ParseFormulaTruthTest( pGate->pForm, (char **)pPinNames, nPins );
    // derive cover
    pGate->pSop = Mio_LibDeriveSop( nPins, pGate->vExpr, pGate->pLib->vCube );
    pGate->pSop = Mio_SopRegister( (Mem_Flex_t *)pGate->pLib->pMmFlex, pGate->pSop );
    // derive truth table
    if ( nPins <= 6 )
        pGate->uTruth = Exp_Truth6( nPins, pGate->vExpr, NULL );
    else if ( nPins <= 8 )
    {
        pGate->pTruth = ABC_CALLOC( word, 4 );
        Exp_Truth8( nPins, pGate->vExpr, NULL, pGate->pTruth );
    }

/*
    // verify
    if ( pGate->nInputs <= 6 )
    {
        extern word Abc_SopToTruth( char * pSop, int nInputs );
        word t2 = Abc_SopToTruth( pGate->pSop, nPins );
        if ( pGate->uTruth != t2 )
        {
            printf( "%s\n", pGate->pForm );
            Exp_Print( nPins, pGate->vExpr );
            printf( "Verification failed!\n" );
        }
    }
*/
    return 0;
}